

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLcode Curl_getformdata(SessionHandle *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  curl_slist *pcVar1;
  ulong uVar2;
  formtype type;
  CURLcode CVar3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *__stream;
  size_t length;
  size_t length_00;
  char *line;
  curl_slist **ppcVar8;
  curl_httppost *file;
  curl_httppost *pcVar9;
  curl_off_t size;
  FormData *form;
  FormData **local_258;
  SessionHandle *local_250;
  FormData *firstform;
  curl_off_t *local_240;
  char buffer [512];
  
  form = (FormData *)0x0;
  size = 0;
  *finalform = (FormData *)0x0;
  if (post == (curl_httppost *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    pcVar6 = formboundary(data);
    if (pcVar6 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar7 = "Content-Type: multipart/form-data";
      if (custom_content_type != (char *)0x0) {
        pcVar7 = custom_content_type;
      }
      local_250 = data;
      CVar3 = AddFormDataf(&form,(curl_off_t *)0x0,"%s; boundary=%s\r\n",pcVar7,pcVar6);
      if (CVar3 == CURLE_OK) {
        firstform = form;
        pcVar7 = (char *)0x0;
        local_258 = finalform;
        local_240 = sizep;
        do {
          if (((((size != 0) && (CVar4 = AddFormDataf(&form,&size,"\r\n"), CVar4 != CURLE_OK)) ||
               (CVar4 = AddFormDataf(&form,&size,"--%s\r\n",pcVar6), CVar4 != CURLE_OK)) ||
              ((CVar4 = AddFormDataf(&form,&size,"Content-Disposition: form-data; name=\""),
               CVar4 != CURLE_OK ||
               (CVar4 = AddFormData(&form,FORM_DATA,post->name,post->namelength,&size),
               CVar4 != CURLE_OK)))) || (CVar4 = AddFormDataf(&form,&size,"\""), CVar4 != CURLE_OK))
          goto LAB_0051dab5;
          pcVar9 = post;
          if (post->more != (curl_httppost *)0x0) {
            (*Curl_cfree)(pcVar7);
            pcVar7 = formboundary(local_250);
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)0x0;
              CVar4 = CURLE_OUT_OF_MEMORY;
              goto LAB_0051dab5;
            }
            CVar4 = AddFormDataf(&form,&size,"\r\nContent-Type: multipart/mixed; boundary=%s\r\n",
                                 pcVar7);
            if (CVar4 != CURLE_OK) goto LAB_0051dab5;
          }
          do {
            if (post->more == (curl_httppost *)0x0) {
              if (((post->flags & 0x51U) != 0) &&
                 ((file = post, (post->flags & 1U) != 0 || (post->showfilename != (char *)0x0))))
              goto LAB_0051d86d;
            }
            else {
              CVar4 = AddFormDataf(&form,&size,"\r\n--%s\r\nContent-Disposition: attachment",pcVar7)
              ;
              file = pcVar9;
              if (CVar4 != CURLE_OK) goto LAB_0051dab5;
LAB_0051d86d:
              CVar4 = formdata_add_filename(file,&form,&size);
              if (CVar4 != CURLE_OK) goto LAB_0051dab5;
            }
            if ((pcVar9->contenttype != (char *)0x0) &&
               (CVar4 = AddFormDataf(&form,&size,"\r\nContent-Type: %s"), CVar4 != CURLE_OK))
            goto LAB_0051dab5;
            ppcVar8 = &pcVar9->contentheader;
            while (pcVar1 = *ppcVar8, pcVar1 != (curl_slist *)0x0) {
              CVar4 = AddFormDataf(&form,&size,"\r\n%s");
              ppcVar8 = &pcVar1->next;
              if (CVar4 != CURLE_OK) goto LAB_0051dab5;
            }
            CVar4 = AddFormDataf(&form,&size,"\r\n\r\n");
            if (CVar4 != CURLE_OK) goto LAB_0051dab5;
            uVar2 = post->flags;
            if ((uVar2 & 3) == 0) {
              if ((uVar2 & 0x10) == 0) {
                length_00 = post->contentslength;
                if ((uVar2 & 0x40) == 0) {
                  line = post->contents;
                  goto LAB_0051da14;
                }
                line = (char *)post->userp;
                type = FORM_CALLBACK;
              }
              else {
                line = post->buffer;
                length_00 = post->bufferlength;
LAB_0051da14:
                type = FORM_CONTENT;
              }
              CVar4 = AddFormData(&form,type,line,length_00,&size);
            }
            else {
              iVar5 = curl_strequal("-",pcVar9->contents);
              __stream = _stdin;
              if (iVar5 == 0) {
                __stream = fopen64(pcVar9->contents,"rb");
              }
              if (__stream == (FILE *)0x0) {
                if (local_250 != (SessionHandle *)0x0) {
                  Curl_failf(local_250,"couldn\'t open file \"%s\"",pcVar9->contents);
                }
                *local_258 = (FormData *)0x0;
                CVar4 = CURLE_READ_ERROR;
              }
              else if (__stream == _stdin) {
                do {
                  length = fread(buffer,1,0x200,__stream);
                  if (length == 0) {
                    CVar4 = CURLE_OK;
                    break;
                  }
                  CVar4 = AddFormData(&form,FORM_CONTENT,buffer,length,&size);
                } while (CVar4 == CURLE_OK);
              }
              else {
                fclose(__stream);
                CVar4 = AddFormData(&form,FORM_FILE,pcVar9->contents,0,&size);
              }
            }
          } while ((pcVar9->more != (curl_httppost *)0x0) &&
                  (pcVar9 = pcVar9->more, CVar4 == CURLE_OK));
          if ((CVar4 != CURLE_OK) ||
             ((post->more != (curl_httppost *)0x0 &&
              (CVar4 = AddFormDataf(&form,&size,"\r\n--%s--",pcVar7), CVar4 != CURLE_OK))))
          goto LAB_0051dab5;
          post = post->next;
        } while (post != (curl_httppost *)0x0);
        CVar3 = CURLE_OK;
        CVar4 = AddFormDataf(&form,&size,"\r\n--%s--\r\n",pcVar6);
        if (CVar4 == CURLE_OK) {
          *local_240 = size;
          (*Curl_cfree)(pcVar7);
          (*Curl_cfree)(pcVar6);
          *local_258 = firstform;
        }
        else {
LAB_0051dab5:
          CVar3 = CVar4;
          Curl_formclean(&firstform);
          (*Curl_cfree)(pcVar7);
          (*Curl_cfree)(pcVar6);
        }
      }
      else {
        (*Curl_cfree)(pcVar6);
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_getformdata(struct SessionHandle *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;

  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char *boundary;
  char *fileboundary = NULL;
  struct curl_slist* curList;

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  boundary = formboundary(data);
  if(!boundary)
    return CURLE_OUT_OF_MEMORY;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    free(boundary);
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      free(fileboundary);
      fileboundary = formboundary(data);
      if(!fileboundary) {
        result = CURLE_OUT_OF_MEMORY;
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf( &form, &size, "\r\n%s", curList->data );
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = strequal("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result)
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size
           is set with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->contentslength, &size);

      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }

  } while((post = post->next) != NULL); /* for each field */

  /* end-boundary for everything */
  if(!result)
    result = AddFormDataf(&form, &size, "\r\n--%s--\r\n", boundary);

  if(result) {
    Curl_formclean(&firstform);
    free(fileboundary);
    free(boundary);
    return result;
  }

  *sizep = size;

  free(fileboundary);
  free(boundary);

  *finalform = firstform;

  return result;
}